

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

ParsedRfcDateTime rfcDateImpl(QStringView s)

{
  ParsedRfcDateTime PVar1;
  QStringView name;
  QStringView name_00;
  QStringView name_01;
  QStringView monthName_00;
  bool bVar2;
  bool bVar3;
  QChar QVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  QStringView *pQVar9;
  qsizetype qVar10;
  long in_FS_OFFSET;
  int minute_1;
  int hour_1;
  bool negate;
  int offset;
  int secs;
  int minute;
  int hour;
  int month;
  int year;
  int day;
  int dayOfWeek;
  int monthIndex;
  int dayIndex;
  bool rfcX22;
  int yearIndex;
  int i;
  QStringView zone;
  QStringView when;
  QTime time;
  QStringView monthName;
  QStringView maybeDayName;
  QStringView dayName;
  anon_class_1_0_00000001 isShortName;
  QDate date;
  bool ok;
  QChar colon;
  iterator it;
  ParsedRfcDateTime result;
  TokenizerResult<const_QStringView_&,_char16_t> tokens;
  QVarLengthArray<QStringView,_6LL> words;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  SplitBehaviorFlags in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  CaseSensitivity in_stack_fffffffffffffc7c;
  QStringView *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc8c;
  QChar in_stack_fffffffffffffc8e;
  undefined4 in_stack_fffffffffffffc90;
  QChar in_stack_fffffffffffffc94;
  undefined2 in_stack_fffffffffffffc96;
  undefined8 in_stack_fffffffffffffc98;
  bool local_347;
  bool local_341;
  bool local_2d9;
  bool local_2a9;
  int local_29c;
  int local_280;
  bool local_271;
  int local_270;
  int local_254;
  QChar local_230;
  char16_t local_22e;
  QChar local_22c;
  char16_t local_22a;
  QStringView local_228;
  int local_214;
  QStringView local_210;
  QStringView local_200;
  QStringView local_1f0;
  char16_t local_1dc;
  char16_t local_1da;
  QStringView local_1d8;
  char16_t local_1be;
  QTime local_1bc;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  qsizetype local_1a8;
  storage_type_conflict *psStack_1a0;
  qsizetype local_198;
  storage_type_conflict *psStack_190;
  undefined1 *local_188;
  storage_type_conflict *psStack_180;
  undefined1 *local_178;
  storage_type_conflict *psStack_170;
  undefined1 *local_168;
  storage_type_conflict *psStack_160;
  char16_t local_154;
  char16_t local_152;
  QStringView local_150;
  QChar local_13a;
  undefined1 *local_138;
  storage_type_conflict *psStack_130;
  QStringView local_128;
  undefined1 local_111;
  undefined1 *local_110;
  byte local_103;
  QChar local_102;
  undefined1 local_100 [62];
  undefined2 local_c2;
  QDate local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [32];
  QVarLengthArray<QStringView,_6LL> local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  ParsedRfcDateTime::ParsedRfcDateTime
            ((ParsedRfcDateTime *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  memset(&local_80,0xaa,0x78);
  QVarLengthArray<QStringView,_6LL>::QVarLengthArray(&local_80);
  local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a0._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a0._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c2 = 0x20;
  QStringView::tokenize<char16_t,Qt::SplitBehaviorFlags>
            (in_stack_fffffffffffffc80,
             (char16_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc74);
  memset(local_100,0xaa,0x38);
  QStringTokenizerBase<QStringView,_QChar>::begin
            ((QStringTokenizerBase<QStringView,_QChar> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_254 = 0;
  while( true ) {
    local_2a9 = false;
    if (local_254 < 6) {
      QStringTokenizerBase<QStringView,_QChar>::end
                ((QStringTokenizerBase<QStringView,_QChar> *)local_a0);
      local_2a9 = operator!=(local_100);
    }
    QVar4.ucs = (char16_t)((ulong)in_stack_fffffffffffffc98 >> 0x30);
    if (local_2a9 == false) break;
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x56a4b4);
    QVarLengthArray<QStringView,6ll>::emplace_back<QStringView_const&>
              ((QVarLengthArray<QStringView,_6LL> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (QStringView *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_254 = local_254 + 1;
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  }
  sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
  if (sVar7 < 3) goto LAB_0056b1aa;
  QStringTokenizerBase<QStringView,_QChar>::end
            ((QStringTokenizerBase<QStringView,_QChar> *)local_a0);
  bVar2 = operator!=(local_100);
  if (bVar2) goto LAB_0056b1aa;
  local_102.ucs = L'ꪪ';
  QChar::QChar<char16_t,_true>(&local_102,L':');
  local_103 = 1;
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate((QDate *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_111 = 0xaa;
  local_128.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_128.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView(&local_128);
  local_271 = true;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_130 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  pvVar8 = QVLABase<QStringView>::front
                     ((QVLABase<QStringView> *)
                      CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_138 = (undefined1 *)pvVar8->m_size;
  psStack_130 = pvVar8->m_data;
  QChar::QChar<char16_t,_true>(&local_13a,L',');
  bVar2 = QStringView::endsWith(in_stack_fffffffffffffc80,in_stack_fffffffffffffc8e);
  if (bVar2) {
    local_150 = QStringView::chopped
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    local_128.m_size = local_150.m_size;
    local_128.m_data = local_150.m_data;
    QVLABase<QStringView>::begin((QVLABase<QStringView> *)0x56a6a2);
    QVLABase<QStringView>::erase
              ((QVLABase<QStringView> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (const_iterator)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  else {
    local_152 = (char16_t)
                QStringView::front((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    bVar2 = QChar::isDigit((QChar *)0x56a6ea);
    local_271 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (local_271) {
      local_128.m_size = (qsizetype)local_138;
      local_128.m_data = psStack_130;
      QVLABase<QStringView>::begin((QVLABase<QStringView> *)0x56a717);
      QVLABase<QStringView>::erase
                ((QVLABase<QStringView> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (const_iterator)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
    local_271 = !local_271;
  }
  sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
  if ((sVar7 < 3) || (sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80), 5 < sVar7))
  goto LAB_0056b1aa;
  if (local_271) {
    local_270 = 2;
  }
  else {
    sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
    local_2d9 = false;
    if (3 < sVar7) {
      QVarLengthArray<QStringView,_6LL>::at
                ((QVarLengthArray<QStringView,_6LL> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      local_154 = local_102.ucs;
      local_2d9 = QStringView::contains(in_stack_fffffffffffffc80,QVar4,in_stack_fffffffffffffc7c);
    }
    local_270 = 2;
    if (local_2d9 != false) {
      local_270 = 3;
    }
  }
  local_280 = 0;
  bVar2 = QStringView::isEmpty((QStringView *)0x56a867);
  if (bVar2) {
LAB_0056a90f:
    QVarLengthArray<QStringView,_6LL>::at
              ((QVarLengthArray<QStringView,_6LL> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    QStringView::toInt((QStringView *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc6c);
    if ((local_103 & 1) == 0) goto LAB_0056b1aa;
    QVarLengthArray<QStringView,_6LL>::at
              ((QVarLengthArray<QStringView,_6LL> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    QStringView::toInt((QStringView *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc6c);
    if ((local_103 & 1) == 0) goto LAB_0056b1aa;
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    psStack_180 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = QVarLengthArray<QStringView,_6LL>::at
                       ((QVarLengthArray<QStringView,_6LL> *)
                        CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_198 = pQVar9->m_size;
    psStack_190 = pQVar9->m_data;
    name_01.m_data._0_4_ = in_stack_fffffffffffffc88;
    name_01.m_size = (qsizetype)in_stack_fffffffffffffc80;
    name_01.m_data._4_2_ = in_stack_fffffffffffffc8c;
    name_01.m_data._6_2_ = in_stack_fffffffffffffc8e.ucs;
    local_188 = (undefined1 *)local_198;
    psStack_180 = psStack_190;
    bVar2 = rfcDateImpl::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),name_01);
    if (!bVar2) goto LAB_0056b1aa;
    local_1a8 = (qsizetype)local_188;
    psStack_1a0 = psStack_180;
    monthName_00.m_data._0_4_ = in_stack_fffffffffffffc88;
    monthName_00.m_size = (qsizetype)in_stack_fffffffffffffc80;
    monthName_00.m_data._4_2_ = in_stack_fffffffffffffc8c;
    monthName_00.m_data._6_2_ = in_stack_fffffffffffffc8e.ucs;
    iVar5 = fromShortMonthName(monthName_00);
    if (-1 < iVar5) {
      QDate::QDate((QDate *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                   in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
      local_110 = local_1b0;
      if ((local_280 != 0) &&
         (iVar5 = QDate::dayOfWeek((QDate *)CONCAT44(in_stack_fffffffffffffc74,
                                                     in_stack_fffffffffffffc70)), iVar5 != local_280
         )) {
        QDate::QDate((QDate *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        local_110 = local_1b8;
      }
    }
  }
  else {
    local_168 = (undefined1 *)local_128.m_size;
    psStack_160 = local_128.m_data;
    name.m_data._0_4_ = in_stack_fffffffffffffc88;
    name.m_size = (qsizetype)in_stack_fffffffffffffc80;
    name.m_data._4_2_ = in_stack_fffffffffffffc8c;
    name.m_data._6_2_ = in_stack_fffffffffffffc8e.ucs;
    bVar2 = rfcDateImpl::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),name);
    if (!bVar2) goto LAB_0056b1aa;
    local_178 = (undefined1 *)local_128.m_size;
    psStack_170 = local_128.m_data;
    name_00.m_data._0_4_ = in_stack_fffffffffffffc88;
    name_00.m_size = (qsizetype)in_stack_fffffffffffffc80;
    name_00.m_data._4_2_ = in_stack_fffffffffffffc8c;
    name_00.m_data._6_2_ = in_stack_fffffffffffffc8e.ucs;
    local_280 = shortDayFromName(name_00);
    if (local_280 != 0) goto LAB_0056a90f;
  }
  QVLABase<QStringView>::remove(&local_80.super_QVLABase<QStringView>,(char *)(long)local_270);
  QVLABase<QStringView>::remove(&local_80.super_QVLABase<QStringView>,(char *)0x0);
  local_1bc.mds = -0x55555556;
  QTime::QTime(&local_1bc);
  sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
  if (sVar7 != 0) {
    QVarLengthArray<QStringView,_6LL>::at
              ((QVarLengthArray<QStringView,_6LL> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_1be = local_102.ucs;
    bVar2 = QStringView::contains(in_stack_fffffffffffffc80,QVar4,in_stack_fffffffffffffc7c);
    if (bVar2) {
      local_1d8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_1d8.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      pvVar8 = QVLABase<QStringView>::front
                         ((QVLABase<QStringView> *)
                          CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      local_1d8.m_size = pvVar8->m_size;
      local_1d8.m_data = pvVar8->m_data;
      QVLABase<QStringView>::begin((QVLABase<QStringView> *)0x56ac29);
      QVLABase<QStringView>::erase
                ((QVLABase<QStringView> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (const_iterator)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      qVar10 = QStringView::size(&local_1d8);
      local_341 = true;
      if (4 < qVar10) {
        local_1da = (char16_t)
                    QStringView::operator[]
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        bVar2 = operator!=((QChar *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           (QChar *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        local_341 = true;
        if (!bVar2) {
          qVar10 = QStringView::size(&local_1d8);
          if (qVar10 == 8) {
            local_1dc = (char16_t)
                        QStringView::operator[]
                                  ((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
            local_347 = operator!=((QChar *)CONCAT44(in_stack_fffffffffffffc74,
                                                     in_stack_fffffffffffffc70),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffc6c,
                                                     in_stack_fffffffffffffc68));
          }
          else {
            qVar10 = QStringView::size(&local_1d8);
            local_347 = 5 < qVar10;
          }
          local_341 = local_347;
        }
      }
      if (local_341 != false) goto LAB_0056b1aa;
      local_1f0 = QStringView::first((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                     0x56ad40);
      QStringView::toInt((QStringView *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         in_stack_fffffffffffffc6c);
      if ((local_103 & 1) == 0) goto LAB_0056b1aa;
      local_200 = QStringView::sliced((QStringView *)
                                      CONCAT26(in_stack_fffffffffffffc96,
                                               CONCAT24(in_stack_fffffffffffffc94.ucs,
                                                        in_stack_fffffffffffffc90)),
                                      CONCAT26(in_stack_fffffffffffffc8e.ucs,
                                               CONCAT24(in_stack_fffffffffffffc8c,
                                                        in_stack_fffffffffffffc88)),
                                      (qsizetype)in_stack_fffffffffffffc80);
      QStringView::toInt((QStringView *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         in_stack_fffffffffffffc6c);
      if ((local_103 & 1) == 0) goto LAB_0056b1aa;
      qVar10 = QStringView::size(&local_1d8);
      if (qVar10 == 8) {
        local_210 = QStringView::last((QStringView *)
                                      CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                                      CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70))
        ;
        QStringView::toInt((QStringView *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           in_stack_fffffffffffffc6c);
      }
      if ((local_103 & 1) == 0) goto LAB_0056b1aa;
      QTime::QTime((QTime *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68,0,0x56aeb2);
      local_1bc.mds = local_214;
    }
  }
  local_29c = 0;
  sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
  if (sVar7 != 0) {
    local_228.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_228.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    pvVar8 = QVLABase<QStringView>::front
                       ((QVLABase<QStringView> *)
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_228.m_size = pvVar8->m_size;
    local_228.m_data = pvVar8->m_data;
    QVLABase<QStringView>::begin((QVLABase<QStringView> *)0x56af29);
    QVLABase<QStringView>::erase
              ((QVLABase<QStringView> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (const_iterator)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
    if ((sVar7 != 0) ||
       ((qVar10 = QStringView::size(&local_228), qVar10 != 3 &&
        (qVar10 = QStringView::size(&local_228), qVar10 != 5)))) goto LAB_0056b1aa;
    bVar2 = false;
    QVar4 = QStringView::operator[]
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    local_22a = QVar4.ucs;
    QChar::QChar<char16_t,_true>(&local_22c,L'-');
    bVar3 = operator==((QChar *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (QChar *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (bVar3) {
      bVar2 = true;
    }
    else {
      in_stack_fffffffffffffc94 =
           QStringView::operator[]
                     ((QStringView *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                      CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      local_22e = in_stack_fffffffffffffc94.ucs;
      QChar::QChar<char16_t,_true>(&local_230,L'+');
      bVar3 = operator!=((QChar *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (QChar *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      if (bVar3) goto LAB_0056b1aa;
    }
    QStringView::sliced((QStringView *)
                        CONCAT26(QVar4.ucs,
                                 CONCAT24(in_stack_fffffffffffffc94.ucs,in_stack_fffffffffffffc90)),
                        CONCAT26(in_stack_fffffffffffffc8e.ucs,
                                 CONCAT24(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)),
                        (qsizetype)in_stack_fffffffffffffc80);
    iVar5 = QStringView::toInt((QStringView *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                               (bool *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                               ,in_stack_fffffffffffffc6c);
    if ((local_103 & 1) == 0) goto LAB_0056b1aa;
    qVar10 = QStringView::size(&local_228);
    if (qVar10 == 5) {
      QStringView::last((QStringView *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                        ,CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      iVar6 = QStringView::toInt((QStringView *)
                                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                                 (bool *)CONCAT44(in_stack_fffffffffffffc74,
                                                  in_stack_fffffffffffffc70),
                                 in_stack_fffffffffffffc6c);
    }
    else {
      iVar6 = 0;
    }
    if ((local_103 & 1) == 0) goto LAB_0056b1aa;
    iVar6 = iVar5 * 0x3c + iVar6;
    local_29c = iVar6 * 0x3c;
    if (bVar2) {
      local_29c = iVar6 * -0x3c;
    }
  }
  local_b0.jd = (qint64)local_110;
  local_a8 = (undefined1 *)CONCAT44(local_29c,local_1bc.mds);
LAB_0056b1aa:
  QVarLengthArray<QStringView,_6LL>::~QVarLengthArray
            ((QVarLengthArray<QStringView,_6LL> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  PVar1._8_8_ = local_a8;
  PVar1.date.jd = local_b0.jd;
  return PVar1;
}

Assistant:

static ParsedRfcDateTime rfcDateImpl(QStringView s)
{
    // Matches "[ddd,] dd MMM yyyy[ hh:mm[:ss]] [±hhmm]" - correct RFC 822, 2822, 5322 format -
    // or           "ddd MMM dd[ hh:mm:ss] yyyy [±hhmm]" - permissive RFC 850, 1036 (read only)
    ParsedRfcDateTime result;

    QVarLengthArray<QStringView, 6> words;

    auto tokens = s.tokenize(u' ', Qt::SkipEmptyParts);
    auto it = tokens.begin();
    for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
        words.emplace_back(*it);

    if (words.size() < 3 || it != tokens.end())
        return result;
    const QChar colon(u':');
    bool ok = true;
    QDate date;

    const auto isShortName = [](QStringView name) {
        return (name.size() == 3 && name[0].isUpper()
                && name[1].isLower() && name[2].isLower());
    };

    /* Reject entirely (return) if the string is malformed; however, if the date
     * is merely invalid, (break, so as to) go on to parsing of the time.
     */
    int yearIndex;
    do { // "loop" so that we can use break on merely invalid, but "right shape" date.
        QStringView dayName;
        bool rfcX22 = true;
        const QStringView maybeDayName = words.front();
        if (maybeDayName.endsWith(u',')) {
            dayName = maybeDayName.chopped(1);
            words.erase(words.begin());
        } else if (!maybeDayName.front().isDigit()) {
            dayName = maybeDayName;
            words.erase(words.begin());
            rfcX22 = false;
        } // else: dayName is not specified (so we can only be RFC *22)
        if (words.size() < 3 || words.size() > 5)
            return result;

        // Don't break before setting yearIndex.
        int dayIndex, monthIndex;
        if (rfcX22) {
            // dd MMM yyyy [hh:mm[:ss]] [±hhmm]
            dayIndex = 0;
            monthIndex = 1;
            yearIndex = 2;
        } else {
            // MMM dd[ hh:mm:ss] yyyy [±hhmm]
            dayIndex = 1;
            monthIndex = 0;
            yearIndex = words.size() > 3 && words.at(2).contains(colon) ? 3 : 2;
        }

        int dayOfWeek = 0;
        if (!dayName.isEmpty()) {
            if (!isShortName(dayName))
                return result;
            dayOfWeek = shortDayFromName(dayName);
            if (!dayOfWeek)
                break;
        }

        const int day = words.at(dayIndex).toInt(&ok);
        if (!ok)
            return result;
        const int year = words.at(yearIndex).toInt(&ok);
        if (!ok)
            return result;
        const QStringView monthName = words.at(monthIndex);
        if (!isShortName(monthName))
            return result;
        int month = fromShortMonthName(monthName);
        if (month < 0)
            break;

        date = QDate(year, month, day);
        if (dayOfWeek && date.dayOfWeek() != dayOfWeek)
            date = QDate();
    } while (false);
    words.remove(yearIndex);
    words.remove(0, 2); // month and day-of-month, in some order

    // Time: [hh:mm[:ss]]
    QTime time;
    if (words.size() && words.at(0).contains(colon)) {
        const QStringView when = words.front();
        words.erase(words.begin());
        if (when.size() < 5 || when[2] != colon
            || (when.size() == 8 ? when[5] != colon : when.size() > 5)) {
            return result;
        }
        const int hour = when.first(2).toInt(&ok);
        if (!ok)
            return result;
        const int minute = when.sliced(3, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto secs = when.size() == 8 ? when.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        time = QTime(hour, minute, secs);
    }

    // Offset: [±hh[mm]]
    int offset = 0;
    if (words.size()) {
        const QStringView zone = words.front();
        words.erase(words.begin());
        if (words.size() || !(zone.size() == 3 || zone.size() == 5))
            return result;
        bool negate = false;
        if (zone[0] == u'-')
            negate = true;
        else if (zone[0] != u'+')
            return result;
        const int hour = zone.sliced(1, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto minute = zone.size() == 5 ? zone.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        offset = (hour * 60 + minute) * 60;
        if (negate)
            offset = -offset;
    }

    result.date = date;
    result.time = time;
    result.utcOffset = offset;
    return result;
}